

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pfrobjs.c
# Opt level: O3

FT_Error pfr_slot_load(FT_GlyphSlot_conflict pfrslot,FT_Size pfrsize,FT_UInt gindex,
                      FT_Int32 load_flags)

{
  FT_GlyphSlot_conflict glyph;
  FT_Outline *outline;
  short sVar1;
  uint uVar2;
  FT_Face pFVar3;
  FT_Stream pFVar4;
  FT_Generic_Finalizer p_Var5;
  undefined8 uVar6;
  short *psVar7;
  FT_GlyphSlot_conflict pFVar8;
  FT_UInt format_00;
  FT_Error FVar9;
  uint uVar10;
  int iVar11;
  uint uVar12;
  long lVar13;
  ulong uVar14;
  uint uVar15;
  ulong uVar16;
  uint uVar17;
  long lVar18;
  byte *pbVar19;
  uint *puVar20;
  int iVar21;
  FT_Long FVar22;
  int iVar23;
  uint uVar24;
  uint uVar25;
  FT_Vector *pFVar26;
  uint uVar27;
  byte *pbVar28;
  byte *pbVar29;
  uint uVar30;
  long lVar31;
  uint uVar32;
  uint *puVar33;
  FT_UInt ysize;
  FT_UInt xsize;
  byte *local_90;
  FT_GlyphSlot_conflict local_88;
  uint local_80;
  uint local_7c;
  FT_UInt format;
  uint local_74;
  FT_Long local_70;
  FT_Long ypos;
  uchar *local_60;
  FT_Long xpos;
  long lStack_50;
  long local_48;
  long lStack_40;
  
  pFVar3 = pfrslot->face;
  uVar10 = gindex - 1;
  if (gindex == 0) {
    uVar10 = 0;
  }
  if (pFVar3 == (FT_Face)0x0) {
    return 6;
  }
  if (*(uint *)&pFVar3[2].generic.data <= uVar10) {
    return 6;
  }
  local_88 = pfrslot;
  local_80 = load_flags;
  if (((load_flags & 9U) == 0) && (iVar11 = *(int *)&pFVar3[2].style_name, iVar11 != 0)) {
    puVar20 = (uint *)((ulong)uVar10 * 0x10 + pFVar3[2].bbox.xMin);
    pFVar4 = pFVar3->stream;
    puVar33 = (uint *)(*(long *)&pFVar3[2].num_fixed_sizes + 0x1c);
    do {
      if ((puVar33[-7] == (uint)(pfrsize->metrics).x_ppem) &&
         (puVar33[-6] == (uint)(pfrsize->metrics).y_ppem)) {
        uVar27 = puVar33[-5];
        FVar9 = FT_Stream_Seek(pFVar4,(ulong)puVar33[-1] + *(long *)&pFVar3[2].units_per_EM);
        if (FVar9 == 0) {
          iVar11 = (uVar27 & 1) + 5;
          if ((uVar27 & 2) == 0) {
            iVar11 = (uVar27 & 1) + 4;
          }
          FVar9 = FT_Stream_EnterFrame
                            (pFVar4,(ulong)((iVar11 + (uint)((uVar27 >> 2 & 1) != 0)) * *puVar33));
          if (FVar9 == 0) {
            pbVar19 = pFVar4->cursor;
            uVar27 = puVar33[-5];
            uVar15 = *puVar33;
            uVar2 = *puVar20;
            uVar24 = uVar27 & 1;
            iVar11 = uVar24 + 5;
            if ((uVar27 & 2) == 0) {
              iVar11 = uVar24 + 4;
            }
            uVar25 = iVar11 + (uint)((uVar27 >> 2 & 1) != 0);
            if ((uVar27 & 0x40) != 0) goto LAB_00149771;
            local_7c = uVar27 | 0x80;
            local_90 = pbVar19 + uVar25 * uVar15;
            pbVar28 = pFVar4->limit;
            puVar33[-5] = local_7c;
            if (pbVar28 < local_90) {
              uVar30 = uVar27 & 0xffffff3f;
              goto LAB_00149769;
            }
            uVar30 = local_7c;
            local_74 = uVar27;
            if (uVar25 * uVar15 == 0) goto LAB_00149769;
            uVar14 = 0xffffffffffffffff;
            pbVar28 = pbVar19;
            goto LAB_00149730;
          }
        }
        break;
      }
      puVar33 = puVar33 + 10;
      iVar11 = iVar11 + -1;
    } while (iVar11 != 0);
  }
  goto LAB_00149370;
  while (pbVar28 = pbVar28 + uVar25, uVar14 = uVar16, pbVar28 < local_90) {
LAB_00149730:
    uVar16 = (ulong)*pbVar28;
    if (uVar24 != 0) {
      uVar16 = (ulong)CONCAT11(*pbVar28,pbVar28[1]);
    }
    if ((long)uVar16 <= (long)uVar14) {
      uVar30 = uVar27 & 0xffffff3f;
      break;
    }
  }
LAB_00149769:
  uVar27 = uVar30 | 0x40;
  puVar33[-5] = uVar27;
LAB_00149771:
  if ((char)uVar27 < '\0') {
    uVar30 = 0;
    do {
      if (uVar15 <= uVar30) goto LAB_00149776;
      uVar32 = uVar30 + uVar15 >> 1;
      uVar14 = (ulong)(uVar32 * uVar25);
      uVar12 = (uint)pbVar19[uVar14];
      if (uVar24 == 0) {
        lVar13 = uVar14 + 1;
      }
      else {
        lVar13 = uVar14 + 2;
        uVar12 = (uint)CONCAT11(pbVar19[uVar14],pbVar19[uVar14 + 1]);
      }
      pbVar28 = pbVar19 + lVar13;
      uVar17 = uVar32 + 1;
      if (uVar2 <= uVar12) {
        uVar17 = uVar30;
      }
      if (uVar12 <= uVar2) {
        uVar30 = uVar17;
        uVar32 = uVar15;
      }
      uVar15 = uVar32;
    } while (uVar12 != uVar2);
    pbVar19 = (byte *)(ulong)*pbVar28;
    if ((uVar27 & 2) == 0) {
      pbVar29 = pbVar28 + 1;
    }
    else {
      pbVar29 = pbVar28 + 2;
      pbVar19 = (byte *)(ulong)CONCAT11(*pbVar28,pbVar28[1]);
    }
    if ((uVar27 & 4) == 0) {
      uVar14 = (ulong)CONCAT11(*pbVar29,pbVar29[1]);
    }
    else {
      uVar14 = (ulong)pbVar29[2] | (ulong)((uint)pbVar29[1] << 8 | (uint)*pbVar29 << 0x10);
    }
    FT_Stream_ExitFrame(pFVar4);
    if (pbVar19 == (byte *)0x0) goto LAB_00149370;
    xpos = 0;
    ypos = 0;
    xsize = 0;
    ysize = 0;
    format = 0;
    FVar22 = (FT_Long)(int)puVar20[1];
    uVar27 = *(uint *)((long)&pFVar3[1].driver + 4);
    lVar13 = FVar22;
    local_90 = pbVar19;
    if (uVar27 != *(uint *)&pFVar3[1].driver) {
      FVar22 = FT_MulDiv(FVar22,(ulong)*(uint *)&pFVar3[1].driver,(ulong)uVar27);
      uVar27 = *(uint *)((long)&pFVar3[1].driver + 4);
      lVar13 = (long)(int)puVar20[1];
    }
    local_88->linearHoriAdvance = FVar22;
    FVar22 = FT_MulDiv((ulong)(pfrsize->metrics).x_ppem << 8,lVar13,(ulong)uVar27);
    local_70 = FVar22;
    FVar9 = FT_Stream_Seek(pFVar4,uVar14 + (uint)pFVar3[1].num_fixed_sizes);
    if ((FVar9 != 0) || (FVar9 = FT_Stream_EnterFrame(pFVar4,(FT_ULong)local_90), FVar9 != 0))
    goto LAB_00149370;
    local_60 = pFVar4->cursor;
    FVar9 = pfr_load_bitmap_metrics
                      (&local_60,pFVar4->limit,FVar22,&xpos,&ypos,&xsize,&ysize,&local_70,&format);
    format_00 = format;
    if (FVar9 != 0) goto LAB_00149776;
    if (format == 2) {
      uVar16 = (ulong)ysize * (ulong)xsize;
      uVar14 = ((ulong)(local_90 + 1) >> 1) * 0xff;
LAB_001499ba:
      if (uVar14 < uVar16) goto LAB_00149776;
    }
    else {
      if (format == 1) {
        uVar16 = (ulong)ysize * (ulong)xsize;
        uVar14 = (long)local_90 * 0xf;
        goto LAB_001499ba;
      }
      if ((format != 0) || (local_90 < (byte *)((ulong)ysize * (ulong)xsize + 7 >> 3)))
      goto LAB_00149776;
    }
    if ((-1 < (int)ysize && (int)xpos == xpos) &&
       (uVar14 = (ulong)ysize,
       -0x80000001 < (long)(ypos + uVar14) && ypos <= (long)(uVar14 ^ 0x7fffffff))) {
      local_88->format = FT_GLYPH_FORMAT_BITMAP;
      (local_88->bitmap).width = xsize;
      (local_88->bitmap).rows = ysize;
      iVar11 = (int)(xsize + 7) >> 3;
      (local_88->bitmap).pitch = iVar11;
      (local_88->bitmap).pixel_mode = '\x01';
      (local_88->metrics).width = (ulong)xsize * 0x40;
      (local_88->metrics).height = uVar14 << 6;
      (local_88->metrics).horiBearingX = xpos << 6;
      (local_88->metrics).horiBearingY = ypos << 6;
      (local_88->metrics).horiAdvance = (local_70 >> 2) + 0x20U & 0xffffffffffffffc0;
      (local_88->metrics).vertBearingX = (long)((ulong)xsize * -0x40) >> 1;
      (local_88->metrics).vertBearingY = 0;
      (local_88->metrics).vertAdvance = (pfrsize->metrics).height;
      local_88->bitmap_left = (int)xpos;
      local_88->bitmap_top = (int)ypos + ysize;
      if ((local_80 >> 0x16 & 1) != 0) {
LAB_00149b05:
        FT_Stream_ExitFrame(pFVar4);
        return 0;
      }
      FVar9 = ft_glyphslot_alloc_bitmap(local_88,(long)iVar11 * uVar14);
      if (FVar9 == 0) {
        pfr_load_bitmap_bits
                  (local_60,pFVar4->limit,format_00,(byte)*(undefined4 *)&pFVar3[1].field_0x4c & 2,
                   &local_88->bitmap);
        goto LAB_00149b05;
      }
    }
  }
LAB_00149776:
  FT_Stream_ExitFrame(pFVar4);
LAB_00149370:
  pFVar8 = local_88;
  if (((uint)load_flags >> 0xe & 1) != 0) {
    return 6;
  }
  lVar13 = pFVar3[2].bbox.xMin;
  lVar18 = (ulong)uVar10 * 0x10;
  local_88->format = FT_GLYPH_FORMAT_OUTLINE;
  (local_88->outline).n_contours = 0;
  (local_88->outline).n_points = 0;
  uVar10 = pFVar3[1].num_fixed_sizes;
  glyph = local_88 + 1;
  pFVar4 = pFVar3->stream;
  local_90 = (byte *)(ulong)*(uint *)(lVar13 + 8 + lVar18);
  uVar27 = *(uint *)(lVar13 + 0xc + lVar18);
  FT_GlyphLoader_Rewind((FT_GlyphLoader)local_88[1].generic.finalizer);
  pFVar8[1].reserved = 0;
  FVar9 = pfr_glyph_load_rec((PFR_Glyph)glyph,pFVar4,(ulong)uVar10,(ulong)uVar27,(FT_ULong)local_90)
  ;
  pFVar8 = local_88;
  if (FVar9 == 0) {
    outline = &local_88->outline;
    p_Var5 = local_88[1].generic.finalizer;
    *(undefined8 *)&(local_88->outline).flags = *(undefined8 *)(p_Var5 + 0x38);
    uVar6 = *(undefined8 *)(p_Var5 + 0x18);
    pFVar26 = *(FT_Vector **)(p_Var5 + 0x20);
    psVar7 = *(short **)(p_Var5 + 0x30);
    (local_88->outline).tags = *(char **)(p_Var5 + 0x28);
    (local_88->outline).contours = psVar7;
    outline->n_contours = (short)uVar6;
    outline->n_points = (short)((ulong)uVar6 >> 0x10);
    *(int *)&outline->field_0x4 = (int)((ulong)uVar6 >> 0x20);
    (local_88->outline).points = pFVar26;
    uVar10 = (local_88->outline).flags & 0xfffffffa;
    (local_88->outline).flags = uVar10 + 4;
    if ((pfrsize != (FT_Size)0x0) && ((pfrsize->metrics).y_ppem < 0x18)) {
      (local_88->outline).flags = uVar10 | 0x104;
    }
    (local_88->metrics).horiAdvance = 0;
    (local_88->metrics).vertAdvance = 0;
    lVar13 = (long)*(int *)(lVar13 + lVar18 + 4);
    uVar10 = *(uint *)((long)&pFVar3[1].driver + 4);
    if (uVar10 != *(uint *)&pFVar3[1].driver) {
      lVar13 = FT_MulDiv(lVar13,(ulong)*(uint *)&pFVar3[1].driver,(ulong)uVar10);
    }
    if (((ulong)pFVar3[1].autohint.data & 1) == 0) {
      (pFVar8->metrics).horiAdvance = lVar13;
      lVar18 = lVar13;
      lVar13 = (pFVar8->metrics).vertAdvance;
    }
    else {
      (pFVar8->metrics).vertAdvance = lVar13;
      lVar18 = (pFVar8->metrics).horiAdvance;
    }
    pFVar8->linearHoriAdvance = lVar18;
    pFVar8->linearVertAdvance = lVar13;
    (pFVar8->metrics).vertBearingX = 0;
    (pFVar8->metrics).vertBearingY = 0;
    if ((local_80 & 1) == 0) {
      sVar1 = (pFVar8->outline).n_points;
      iVar23 = (int)sVar1;
      iVar21 = (int)(pfrsize->metrics).x_scale;
      iVar11 = (int)(pfrsize->metrics).y_scale;
      if (0 < sVar1) {
        pFVar26 = (pFVar8->outline).points;
        do {
          lVar31 = (long)(int)pFVar26->x * (long)iVar21;
          pFVar26->x = (long)(int)((ulong)(lVar31 + 0x8000 + (lVar31 >> 0x3f)) >> 0x10);
          lVar31 = (long)(int)pFVar26->y * (long)iVar11;
          pFVar26->y = (long)(int)((ulong)(lVar31 + 0x8000 + (lVar31 >> 0x3f)) >> 0x10);
          pFVar26 = pFVar26 + 1;
          iVar23 = iVar23 + -1;
        } while (iVar23 != 0);
      }
      lVar18 = (long)(int)lVar18 * (long)iVar21;
      (pFVar8->metrics).horiAdvance =
           (long)(int)((ulong)(lVar18 + 0x8000 + (lVar18 >> 0x3f)) >> 0x10);
      lVar13 = (long)(int)lVar13 * (long)iVar11;
      (pFVar8->metrics).vertAdvance =
           (long)(int)((ulong)(lVar13 + 0x8000 + (lVar13 >> 0x3f)) >> 0x10);
    }
    FT_Outline_Get_CBox(outline,(FT_BBox *)&xpos);
    (pFVar8->metrics).width = local_48 - xpos;
    (pFVar8->metrics).height = lStack_40 - lStack_50;
    (pFVar8->metrics).horiBearingX = xpos;
    (pFVar8->metrics).horiBearingY = lStack_50;
    return 0;
  }
  return FVar9;
}

Assistant:

FT_LOCAL_DEF( FT_Error )
  pfr_slot_load( FT_GlyphSlot  pfrslot,         /* PFR_Slot */
                 FT_Size       pfrsize,         /* PFR_Size */
                 FT_UInt       gindex,
                 FT_Int32      load_flags )
  {
    PFR_Slot     slot    = (PFR_Slot)pfrslot;
    PFR_Size     size    = (PFR_Size)pfrsize;
    FT_Error     error;
    PFR_Face     face    = (PFR_Face)pfrslot->face;
    PFR_Char     gchar;
    FT_Outline*  outline = &pfrslot->outline;
    FT_ULong     gps_offset;


    FT_TRACE1(( "pfr_slot_load: glyph index %d\n", gindex ));

    if ( gindex > 0 )
      gindex--;

    if ( !face || gindex >= face->phy_font.num_chars )
    {
      error = FT_THROW( Invalid_Argument );
      goto Exit;
    }

    /* try to load an embedded bitmap */
    if ( ( load_flags & ( FT_LOAD_NO_SCALE | FT_LOAD_NO_BITMAP ) ) == 0 )
    {
      error = pfr_slot_load_bitmap(
                slot,
                size,
                gindex,
                ( load_flags & FT_LOAD_BITMAP_METRICS_ONLY ) != 0 );
      if ( !error )
        goto Exit;
    }

    if ( load_flags & FT_LOAD_SBITS_ONLY )
    {
      error = FT_THROW( Invalid_Argument );
      goto Exit;
    }

    gchar               = face->phy_font.chars + gindex;
    pfrslot->format     = FT_GLYPH_FORMAT_OUTLINE;
    outline->n_points   = 0;
    outline->n_contours = 0;
    gps_offset          = face->header.gps_section_offset;

    /* load the glyph outline (FT_LOAD_NO_RECURSE isn't supported) */
    error = pfr_glyph_load( &slot->glyph, face->root.stream,
                            gps_offset, gchar->gps_offset, gchar->gps_size );

    if ( !error )
    {
      FT_BBox            cbox;
      FT_Glyph_Metrics*  metrics = &pfrslot->metrics;
      FT_Pos             advance;
      FT_UInt            em_metrics, em_outline;
      FT_Bool            scaling;


      scaling = FT_BOOL( ( load_flags & FT_LOAD_NO_SCALE ) == 0 );

      /* copy outline data */
      *outline = slot->glyph.loader->base.outline;

      outline->flags &= ~FT_OUTLINE_OWNER;
      outline->flags |= FT_OUTLINE_REVERSE_FILL;

      if ( size && pfrsize->metrics.y_ppem < 24 )
        outline->flags |= FT_OUTLINE_HIGH_PRECISION;

      /* compute the advance vector */
      metrics->horiAdvance = 0;
      metrics->vertAdvance = 0;

      advance    = gchar->advance;
      em_metrics = face->phy_font.metrics_resolution;
      em_outline = face->phy_font.outline_resolution;

      if ( em_metrics != em_outline )
        advance = FT_MulDiv( advance,
                             (FT_Long)em_outline,
                             (FT_Long)em_metrics );

      if ( face->phy_font.flags & PFR_PHY_VERTICAL )
        metrics->vertAdvance = advance;
      else
        metrics->horiAdvance = advance;

      pfrslot->linearHoriAdvance = metrics->horiAdvance;
      pfrslot->linearVertAdvance = metrics->vertAdvance;

      /* make up vertical metrics(?) */
      metrics->vertBearingX = 0;
      metrics->vertBearingY = 0;

#if 0 /* some fonts seem to be broken here! */

      /* Apply the font matrix, if any.                 */
      /* TODO: Test existing fonts with unusual matrix  */
      /* whether we have to adjust Units per EM.        */
      {
        FT_Matrix font_matrix;


        font_matrix.xx = face->log_font.matrix[0] << 8;
        font_matrix.yx = face->log_font.matrix[1] << 8;
        font_matrix.xy = face->log_font.matrix[2] << 8;
        font_matrix.yy = face->log_font.matrix[3] << 8;

        FT_Outline_Transform( outline, &font_matrix );
      }
#endif

      /* scale when needed */
      if ( scaling )
      {
        FT_Int      n;
        FT_Fixed    x_scale = pfrsize->metrics.x_scale;
        FT_Fixed    y_scale = pfrsize->metrics.y_scale;
        FT_Vector*  vec     = outline->points;


        /* scale outline points */
        for ( n = 0; n < outline->n_points; n++, vec++ )
        {
          vec->x = FT_MulFix( vec->x, x_scale );
          vec->y = FT_MulFix( vec->y, y_scale );
        }

        /* scale the advance */
        metrics->horiAdvance = FT_MulFix( metrics->horiAdvance, x_scale );
        metrics->vertAdvance = FT_MulFix( metrics->vertAdvance, y_scale );
      }

      /* compute the rest of the metrics */
      FT_Outline_Get_CBox( outline, &cbox );

      metrics->width        = cbox.xMax - cbox.xMin;
      metrics->height       = cbox.yMax - cbox.yMin;
      metrics->horiBearingX = cbox.xMin;
      metrics->horiBearingY = cbox.yMax - metrics->height;
    }

  Exit:
    return error;
  }